

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

json * __thiscall
argo::json::append(json *this,unique_ptr<argo::json,_std::default_delete<argo::json>_> *j)

{
  json_exception *this_00;
  char *json_type_name;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> local_28;
  pointer local_20;
  json *jp;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> *j_local;
  json *this_local;
  
  jp = (json *)j;
  j_local = (unique_ptr<argo::json,_std::default_delete<argo::json>_> *)this;
  if (this->m_type == array_e) {
    local_20 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::release(j);
    std::unique_ptr<argo::json,std::default_delete<argo::json>>::
    unique_ptr<std::default_delete<argo::json>,void>
              ((unique_ptr<argo::json,std::default_delete<argo::json>> *)&local_28,local_20);
    std::
    vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
    ::push_back((vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                 *)&(this->m_value).u_object,(value_type *)&local_28);
    std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&local_28);
    return local_20;
  }
  this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
  json_type_name = get_instance_type_name(this);
  json_exception::json_exception(this_00,not_an_array_e,json_type_name);
  __cxa_throw(this_00,&json_exception::typeinfo,json_exception::~json_exception);
}

Assistant:

const json &json::append(unique_ptr<json> j)
{
    if (m_type == array_e)
    {
        json *jp = j.release();
        m_value.u_array.push_back(unique_ptr<json>(jp));
        return *jp;
    }
    else
    {
        throw json_exception(json_exception::not_an_array_e, get_instance_type_name());
    }
}